

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

CppStringType __thiscall google::protobuf::FieldDescriptor::cpp_string_type(FieldDescriptor *this)

{
  RepeatedField<int> *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint extraout_EAX;
  MessageLite *pMVar4;
  SourceCodeInfo_Location *pSVar5;
  int *piVar6;
  const_reference piVar7;
  Rep *pRVar8;
  undefined8 extraout_RAX;
  undefined7 extraout_var;
  byte bVar9;
  int *extraout_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  SourceLocation *out_location;
  undefined1 *puVar10;
  FileDescriptor *this_01;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar11;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  vector<int,_std::allocator<int>_> vStack_78;
  _Alloc_hider _Stack_48;
  
  if ((this->type_ == '\t') || (this->type_ == '\f')) {
    pMVar4 = internal::ExtensionSet::GetMessage
                       (&(this->merged_features_->field_0)._impl_._extensions_,pb::cpp,
                        (MessageLite *)PTR__CppFeatures_default_instance__004c50f0);
    iVar2 = (int)pMVar4[1]._internal_metadata_.ptr_;
    if (iVar2 == 1) {
      return kView;
    }
    if (iVar2 == 3) {
      return kString;
    }
    if (iVar2 == 2) {
      if (this->type_ != '\f') {
        return kString;
      }
      bVar9 = this->field_0x1;
      if (0xbf < bVar9 == (bool)((bVar9 & 0x20) >> 5)) {
        if ((bVar9 & 0x20) == 0) {
          return kString - ((bVar9 & 8) == 0);
        }
        return kString;
      }
    }
    else {
      pMVar4 = internal::ExtensionSet::GetMessage
                         (&(this->merged_features_->field_0)._impl_._extensions_,pb::cpp,
                          (MessageLite *)PTR__CppFeatures_default_instance__004c50f0);
      if (((ulong)pMVar4[1]._vptr_MessageLite & 1) == 0) {
        return kString;
      }
      cpp_string_type();
      bVar9 = (byte)pMVar4;
    }
    in_RSI = (vector<int,_std::allocator<int>_> *)(ulong)(0xbf < bVar9);
    cpp_string_type();
  }
  puVar10 = &stack0xffffffffffffffe0;
  cpp_string_type();
  _Stack_48._M_p = (pointer)this;
  if (extraout_RDX == (int *)0x0) {
    vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x1eba59;
    FileDescriptor::GetSourceLocation();
  }
  else {
    if (*(SourceCodeInfo **)(puVar10 + 0xa0) == (SourceCodeInfo *)0x0) {
      return 0;
    }
    vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x1eb8d9;
    pSVar5 = FileDescriptorTables::GetSourceLocation
                       (*(FileDescriptorTables **)(puVar10 + 0x98),in_RSI,
                        *(SourceCodeInfo **)(puVar10 + 0xa0));
    if (pSVar5 == (SourceCodeInfo_Location *)0x0) {
      return 0;
    }
    this_00 = &(pSVar5->field_0)._impl_.span_;
    vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x1eb8fb;
    iVar2 = internal::SooRep::size
                      (&this_00->soo_rep_,(*(byte *)((long)&pSVar5->field_0 + 0x20) & 4) == 0);
    if (iVar2 != 3) {
      vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x1eb912;
      iVar2 = internal::SooRep::size
                        (&this_00->soo_rep_,
                         (undefined1  [16])
                         ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                         (undefined1  [16])0x0);
      if (iVar2 != 4) {
        return 0;
      }
    }
    vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x1eb92d;
    iVar2 = internal::SooRep::size
                      (&this_00->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    if (0 < iVar2) {
      vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x1eb947;
      piVar6 = RepeatedField<int>::elements
                         (this_00,(undefined1  [16])
                                  ((undefined1  [16])(this_00->soo_rep_).field_0 &
                                  (undefined1  [16])0x4) == (undefined1  [16])0x0);
      *extraout_RDX = *piVar6;
      vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x1eb95d;
      uVar3 = internal::SooRep::size
                        (&this_00->soo_rep_,
                         (undefined1  [16])
                         ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                         (undefined1  [16])0x0);
      if (1 < (int)uVar3) {
        vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x1eb979;
        piVar6 = RepeatedField<int>::elements
                           (this_00,(*(byte *)((long)&pSVar5->field_0 + 0x20) & 4) == 0);
        extraout_RDX[2] = piVar6[1];
        vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x1eb992;
        iVar2 = internal::SooRep::size
                          (&this_00->soo_rep_,(*(byte *)((long)&pSVar5->field_0 + 0x20) & 4) == 0);
        vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x1eb9a5;
        piVar7 = RepeatedField<int>::Get(this_00,(uint)(iVar2 != 3) * 2);
        extraout_RDX[1] = *piVar7;
        vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x1eb9bd;
        iVar2 = internal::SooRep::size
                          (&this_00->soo_rep_,(*(byte *)((long)&pSVar5->field_0 + 0x20) & 4) == 0);
        vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x1eb9c8;
        piVar7 = RepeatedField<int>::Get(this_00,iVar2 + -1);
        extraout_RDX[3] = *piVar7;
        vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x1eb9de;
        std::__cxx11::string::_M_assign((string *)(extraout_RDX + 4));
        vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x1eb9ef;
        std::__cxx11::string::_M_assign((string *)(extraout_RDX + 0xc));
        this_02 = &(pSVar5->field_0)._impl_.leading_detached_comments_;
        pRVar11 = this_02;
        if ((*(byte *)((long)&pSVar5->field_0 + 0x38) & 1) != 0) {
          vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x1eba12;
          pRVar8 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
          pRVar11 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)pRVar8->elements;
          if (((ulong)(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
            vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x1eba27;
            pRVar8 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
            this_02 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)pRVar8->elements;
          }
        }
        vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x1eba41;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_assign_aux<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::string_const>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   (extraout_RDX + 0x14),pRVar11,
                   &(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                   *(int *)((long)&pSVar5->field_0 + 0x40));
        return (CppStringType)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      goto LAB_001eba65;
    }
  }
  vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x1eba65;
  FileDescriptor::GetSourceLocation();
  uVar3 = extraout_EAX;
LAB_001eba65:
  out_location = (SourceLocation *)&stack0xffffffffffffffa8;
  this_01 = (FileDescriptor *)(ulong)uVar3;
  vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x1eba71;
  FileDescriptor::GetSourceLocation();
  vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vStack_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar1 = FileDescriptor::GetSourceLocation(this_01,&vStack_78,out_location);
  return (CppStringType)CONCAT71(extraout_var,bVar1);
}

Assistant:

FieldDescriptor::CppStringType FieldDescriptor::cpp_string_type() const {
  ABSL_DCHECK(cpp_type() == FieldDescriptor::CPPTYPE_STRING);
  switch (features().GetExtension(pb::cpp).string_type()) {
    case pb::CppFeatures::VIEW:
      return CppStringType::kView;
    case pb::CppFeatures::CORD:
      // In open-source, protobuf CORD is only supported for singular bytes
      // fields.
      if (type() != FieldDescriptor::TYPE_BYTES || is_repeated() ||
          is_extension()) {
        return CppStringType::kString;
      }
      return CppStringType::kCord;
    case pb::CppFeatures::STRING:
      return CppStringType::kString;
    default:
      // If features haven't been resolved, this is a dynamic build not for C++
      // codegen.  Just use string type.
      ABSL_DCHECK(!features().GetExtension(pb::cpp).has_string_type());
      return CppStringType::kString;
  }
}